

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O3

ElementPtr __thiscall
Rml::ElementInstancerElement::InstanceElement
          (ElementInstancerElement *this,Element *param_1,String *tag,XMLAttributes *param_3)

{
  int iVar1;
  int iVar2;
  ObserverPtrBlock *pOVar3;
  code *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  Element *this_00;
  
  if ((element_instancer_pools._8_8_ == 0) &&
     (bVar6 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46), !bVar6)) {
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  uVar5 = element_instancer_pools._8_8_;
  this_00 = *(Element **)(element_instancer_pools._8_8_ + 0x18);
  if (this_00 == (Element *)0x0) {
    if (*(char *)(element_instancer_pools._8_8_ + 4) == '\x01') {
      Pool<Rml::Element>::CreateChunk((Pool<Rml::Element> *)element_instancer_pools._8_8_);
      this_00 = *(Element **)(uVar5 + 0x18);
      if (this_00 != (Element *)0x0) goto LAB_0022b2c0;
    }
    this_00 = (Element *)0x0;
  }
  else {
LAB_0022b2c0:
    iVar2 = *(int *)(uVar5 + 0x20);
    iVar1 = iVar2 + 1;
    *(int *)(uVar5 + 0x20) = iVar1;
    if (*(int *)(uVar5 + 0x24) <= iVar2) {
      *(int *)(uVar5 + 0x24) = iVar1;
    }
    pOVar3 = this_00[1].super_EnableObserverPtr<Rml::Element>.block;
    *(ObserverPtrBlock **)(uVar5 + 0x18) = pOVar3;
    if (pOVar3 != (ObserverPtrBlock *)0x0) {
      pOVar3[0x18].pointed_to_object = (void *)0x0;
    }
    pOVar3 = *(ObserverPtrBlock **)(uVar5 + 0x10);
    this_00[1].super_ScriptInterface.super_Releasable._vptr_Releasable = (_func_int **)0x0;
    if (pOVar3 != (ObserverPtrBlock *)0x0) {
      pOVar3[0x18].pointed_to_object = this_00;
    }
    this_00[1].super_EnableObserverPtr<Rml::Element>.block = pOVar3;
    *(Element **)(uVar5 + 0x10) = this_00;
    Element::Element(this_00,(String *)param_3);
  }
  (this->super_ElementInstancer)._vptr_ElementInstancer = (_func_int **)this_00;
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr ElementInstancerElement::InstanceElement(Element* /*parent*/, const String& tag, const XMLAttributes& /*attributes*/)
{
	Element* ptr = element_instancer_pools->pool_element.AllocateAndConstruct(tag);
	return ElementPtr(ptr);
}